

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

string * __thiscall
GLRParser::symbolAfterMarker_abi_cxx11_
          (string *__return_storage_ptr__,GLRParser *this,Production *production)

{
  pointer pbVar1;
  __type _Var2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer __lhs;
  string symbol;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = 0;
  local_60 = '\0';
  local_70 = &local_60;
  pvVar3 = Production::getToP_abi_cxx11_((Production *)this);
  __lhs = (pvVar3->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var2 = false;
  do {
    if (__lhs == pbVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_70 == &local_60) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_70;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      }
      __return_storage_ptr__->_M_string_length = local_68;
      local_68 = 0;
      local_60 = '\0';
      local_70 = &local_60;
LAB_00127eaf:
      std::__cxx11::string::~string((string *)&local_70);
      return __return_storage_ptr__;
    }
    if (_Var2 != false) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__lhs);
      goto LAB_00127eaf;
    }
    getMarker_abi_cxx11_();
    _Var2 = std::operator==(__lhs,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

std::string GLRParser::symbolAfterMarker(const Production *production) {
    std::string symbol;
    bool previousmarker = false;
    for (const std::string &var: production->getToP()) {
        if (previousmarker) {
            return var;
        }
        previousmarker = (var == getMarker());
    }
    return symbol;
}